

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[2],unsigned_int&>
          (String *__return_storage_ptr__,kj *this,char (*params) [2],uint *params_1)

{
  char (*value) [2];
  kj *this_00;
  uint *value_00;
  CappedArray<char,_14UL> local_48;
  ArrayPtr<const_char> local_30;
  char (*local_20) [2];
  uint *params_local_1;
  char (*params_local) [2];
  
  local_20 = params;
  params_local_1 = (uint *)this;
  params_local = (char (*) [2])__return_storage_ptr__;
  value = ::const((char (*) [2])this);
  local_30 = toCharSequence<char_const(&)[2]>(value);
  this_00 = (kj *)fwd<unsigned_int&>((uint *)local_20);
  toCharSequence<unsigned_int&>(&local_48,this_00,value_00);
  _::concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>>
            (__return_storage_ptr__,(_ *)&local_30,(ArrayPtr<const_char> *)&local_48,
             (CappedArray<char,_14UL> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}